

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O2

pseudo_t linearize_statement(dmr_C *C,entrypoint *ep,statement *stmt)

{
  allocator *paVar1;
  anon_union_24_12_0e8c74c2_for_instruction_7 *listp;
  unsigned_long_long uVar2;
  expression_list *peVar3;
  statement *psVar4;
  statement *stmt_00;
  statement *stmt_01;
  expression *expr;
  statement_list *psVar5;
  basic_block *pbVar6;
  pseudo_t ppVar7;
  instruction *piVar8;
  pseudo_t ppVar9;
  basic_block *pbVar10;
  expression *peVar11;
  pseudo_t *pppVar12;
  symbol *psVar13;
  basic_block *pbVar14;
  multijmp *pmVar15;
  unsigned_long_long end;
  unsigned_long_long begin;
  int iVar16;
  ptr_list_iter local_a8;
  basic_block *local_90;
  undefined1 auStack_88 [8];
  ptr_list_iter symiter__;
  basic_block *local_60;
  expression *local_50;
  basic_block *local_48;
  
LAB_0012bda3:
  if (stmt == (statement *)0x0) goto switchD_0012bde7_default;
  pbVar10 = ep->active;
  if ((pbVar10 != (basic_block *)0x0) && (pbVar10->insns == (instruction_list *)0x0)) {
    pbVar10->pos = stmt->pos;
  }
  C->L->current_pos = stmt->pos;
  switch(stmt->type) {
  case STMT_DECLARATION:
    ptrlist_concat((ptr_list *)(stmt->field_2).field_1.expression,(ptr_list **)&ep->syms);
    ptrlist_forward_iterator
              ((ptr_list_iter *)auStack_88,(ptr_list *)(stmt->field_2).field_1.expression);
    while (psVar13 = (symbol *)ptrlist_iter_next((ptr_list_iter *)auStack_88),
          psVar13 != (symbol *)0x0) {
      linearize_one_symbol(C,ep,psVar13);
    }
    goto switchD_0012bde7_default;
  case STMT_EXPRESSION:
    ppVar9 = linearize_expression(C,ep,(stmt->field_2).field_1.expression);
    return ppVar9;
  case STMT_COMPOUND:
    if ((stmt->field_2).field_3.if_false != (statement *)0x0) {
      piVar8 = alloc_instruction(C,0x34,0);
      peVar3 = (stmt->field_2).field_10.asm_clobbers;
      if (peVar3 != (expression_list *)0x0) {
        ptrlist_concat((ptr_list *)peVar3->next_,(ptr_list **)&ep->syms);
        ptrlist_forward_iterator((ptr_list_iter *)auStack_88,(ptr_list *)peVar3->next_);
        psVar13 = (symbol *)ptrlist_iter_next((ptr_list_iter *)auStack_88);
        while (psVar13 != (symbol *)0x0) {
          ppVar9 = linearize_one_symbol(C,ep,psVar13);
          pppVar12 = (pseudo_t *)
                     ptrlist_add((ptr_list **)&(piVar8->field_6).field_1.bb_false,ppVar9,
                                 &C->ptrlist_allocator);
          dmrC_use_pseudo(C,piVar8,ppVar9,pppVar12);
          psVar13 = (symbol *)ptrlist_iter_next((ptr_list_iter *)auStack_88);
        }
      }
      ppVar9 = linearize_compound_statement(C,ep,stmt);
      (piVar8->field_5).target = ppVar9;
      ppVar7 = symbol_pseudo(C,ep,(stmt->field_2).field_4.inline_fn);
      dmrC_use_pseudo(C,piVar8,ppVar7,(pseudo_t *)&(piVar8->field_6).field_0);
      pbVar10 = ep->active;
      if ((pbVar10 != (basic_block *)0x0) && (pbVar10->insns == (instruction_list *)0x0)) {
        pbVar10->pos = stmt->pos;
      }
      add_one_insn(C,ep,piVar8);
      return ppVar9;
    }
    ppVar9 = linearize_compound_statement(C,ep,stmt);
    return ppVar9;
  case STMT_IF:
    peVar11 = (stmt->field_2).field_1.expression;
    pbVar10 = alloc_basic_block(C,ep,stmt->pos);
    pbVar14 = alloc_basic_block(C,ep,stmt->pos);
    linearize_cond_branch(C,ep,peVar11,pbVar10,pbVar14);
    set_activeblock(C,ep,pbVar10);
    linearize_statement(C,ep,(stmt->field_2).field_3.if_true);
    pbVar10 = pbVar14;
    if ((stmt->field_2).field_3.if_false != (statement *)0x0) {
      pbVar10 = alloc_basic_block(C,ep,stmt->pos);
      add_goto(C,ep,pbVar10);
      set_activeblock(C,ep,pbVar14);
      linearize_statement(C,ep,(stmt->field_2).field_3.if_false);
    }
    goto LAB_0012c734;
  case STMT_RETURN:
    peVar11 = (stmt->field_2).field_1.expression;
    pbVar10 = get_bound_block(C,ep,(stmt->field_2).field_2.ret_target);
    ppVar9 = linearize_expression(C,ep,peVar11);
    pbVar14 = ep->active;
    if ((pbVar14 != (basic_block *)0x0) && (ppVar9 != &C->L->void_pseudo)) {
      piVar8 = (instruction *)ptrlist_first((ptr_list *)pbVar10->insns);
      if (piVar8 == (instruction *)0x0) {
        piVar8 = alloc_typed_instruction(C,0x2e,peVar11->ctype);
        ppVar7 = dmrC_alloc_pseudo(C,piVar8);
        (piVar8->field_5).target = ppVar7;
        piVar8->bb = pbVar10;
        ptrlist_add((ptr_list **)&pbVar10->insns,piVar8,&C->ptrlist_allocator);
      }
      ppVar9 = dmrC_alloc_phi(C,pbVar14,ppVar9,peVar11->ctype);
      ppVar9->ident = C->S->return_ident;
      pppVar12 = (pseudo_t *)
                 ptrlist_add((ptr_list **)&(piVar8->field_6).field_0,ppVar9,&C->ptrlist_allocator);
      dmrC_use_pseudo(C,piVar8,ppVar9,pppVar12);
    }
    break;
  case STMT_CASE:
    add_label(C,ep,(stmt->field_2).field_6.case_label);
    linearize_statement(C,ep,(stmt->field_2).field_3.if_false);
    goto switchD_0012bde7_default;
  case STMT_SWITCH:
    pbVar14 = alloc_basic_block(C,ep,stmt->pos);
    peVar11 = (stmt->field_2).field_1.expression;
    ppVar9 = linearize_expression(C,ep,peVar11);
    pbVar10 = ep->active;
    if (pbVar10 != (basic_block *)0x0) {
      piVar8 = alloc_typed_instruction(C,5,peVar11->ctype);
      dmrC_use_pseudo(C,piVar8,ppVar9,&(piVar8->field_5).target);
      add_one_insn(C,ep,piVar8);
      if (ep->active != (basic_block *)0x0) {
        ep->active = (basic_block *)0x0;
      }
      ptrlist_forward_iterator
                ((ptr_list_iter *)auStack_88,
                 (ptr_list *)((stmt->field_2).field_10.asm_clobbers)->list_[0xf]);
      psVar13 = (symbol *)ptrlist_iter_next((ptr_list_iter *)auStack_88);
      listp = &piVar8->field_6;
      paVar1 = &C->ptrlist_allocator;
      local_60 = (basic_block *)0x0;
      while (psVar13 != (symbol *)0x0) {
        psVar4 = (psVar13->field_14).field_2.stmt;
        pbVar6 = get_bound_block(C,ep,psVar13);
        peVar11 = (psVar4->field_2).field_1.expression;
        if (peVar11 != (expression *)0x0) {
          begin = (peVar11->field_5).field_0.value;
          peVar11 = (psVar4->field_2).field_1.context;
          end = begin;
          if ((peVar11 != (expression *)0x0) &&
             (uVar2 = (peVar11->field_5).field_0.value, end = uVar2, (long)uVar2 < (long)begin)) {
            end = begin;
            begin = uVar2;
          }
          pmVar15 = alloc_multijmp(C,pbVar6,begin,end);
          ptrlist_add((ptr_list **)&listp->field_0,pmVar15,paVar1);
          ptrlist_add((ptr_list **)&pbVar6->parents,pbVar10,paVar1);
          ptrlist_add((ptr_list **)&pbVar10->children,pbVar6,paVar1);
          pbVar6 = local_60;
        }
        local_60 = pbVar6;
        psVar13 = (symbol *)ptrlist_iter_next((ptr_list_iter *)auStack_88);
      }
      bind_label(C,(stmt->field_2).field_4.inline_fn,pbVar14,stmt->pos);
      linearize_statement(C,ep,(stmt->field_2).field_3.if_true);
      set_activeblock(C,ep,pbVar14);
      if (local_60 != (basic_block *)0x0) {
        pbVar14 = local_60;
      }
      pmVar15 = alloc_multijmp(C,pbVar14,1,0);
      ptrlist_add((ptr_list **)&listp->field_0,pmVar15,paVar1);
      ptrlist_add((ptr_list **)&pbVar14->parents,pbVar10,paVar1);
      ptrlist_add((ptr_list **)&pbVar10->children,pbVar14,paVar1);
      ptrlist_sort((ptr_list **)&listp->field_0,C,multijmp_cmp);
    }
    goto switchD_0012bde7_default;
  case STMT_ITERATOR:
    psVar4 = (stmt->field_2).field_4.args;
    peVar11 = (stmt->field_2).field_8.iterator_pre_condition;
    stmt_00 = (stmt->field_2).field_8.iterator_statement;
    stmt_01 = (stmt->field_2).field_8.iterator_post_statement;
    expr = (stmt->field_2).field_8.iterator_post_condition;
    ptrlist_forward_iterator
              ((ptr_list_iter *)auStack_88,(ptr_list *)(stmt->field_2).field_3.if_false);
    while (psVar13 = (symbol *)ptrlist_iter_next((ptr_list_iter *)auStack_88),
          psVar13 != (symbol *)0x0) {
      linearize_one_symbol(C,ep,psVar13);
    }
    ptrlist_concat((ptr_list *)(stmt->field_2).field_3.if_false,(ptr_list **)&ep->syms);
    linearize_statement(C,ep,psVar4);
    pbVar14 = alloc_basic_block(C,ep,stmt->pos);
    local_90 = alloc_basic_block(C,ep,stmt->pos);
    pbVar10 = alloc_basic_block(C,ep,stmt->pos);
    local_48 = pbVar14;
    if (expr == (expression *)0x0) {
      local_48 = alloc_basic_block(C,ep,stmt->pos);
      set_activeblock(C,ep,local_48);
    }
    if (peVar11 != (expression *)0x0) {
      linearize_cond_branch(C,ep,peVar11,pbVar14,pbVar10);
    }
    pbVar6 = local_90;
    bind_label(C,(stmt->field_2).field_2.ret_target,local_90,stmt->pos);
    bind_label(C,(stmt->field_2).field_5.label_identifier,pbVar10,stmt->pos);
    set_activeblock(C,ep,pbVar14);
    linearize_statement(C,ep,stmt_00);
    add_goto(C,ep,pbVar6);
    set_activeblock(C,ep,pbVar6);
    linearize_statement(C,ep,stmt_01);
    if (expr == (expression *)0x0) {
      add_goto(C,ep,local_48);
    }
    else {
      linearize_cond_branch(C,ep,expr,local_48,pbVar10);
    }
LAB_0012c734:
    set_activeblock(C,ep,pbVar10);
switchD_0012bde7_default:
    return &C->L->void_pseudo;
  case STMT_LABEL:
    goto switchD_0012bde7_caseD_9;
  case STMT_GOTO:
    pbVar10 = ep->active;
    if (pbVar10 == (basic_block *)0x0) goto switchD_0012bde7_default;
    psVar13 = (stmt->field_2).field_5.label_identifier;
    if (psVar13 == (symbol *)0x0) {
      peVar11 = (stmt->field_2).field_1.context;
      if (peVar11 == (expression *)0x0) goto switchD_0012bde7_default;
      if (*(char *)peVar11 != '\x17') {
        ppVar9 = linearize_expression(C,ep,peVar11);
        piVar8 = alloc_instruction(C,7,0);
        dmrC_use_pseudo(C,piVar8,ppVar9,&(piVar8->field_5).target);
        add_one_insn(C,ep,piVar8);
        ptrlist_forward_iterator
                  ((ptr_list_iter *)auStack_88,(ptr_list *)(stmt->field_2).field_3.if_false);
        psVar13 = (symbol *)ptrlist_iter_next((ptr_list_iter *)auStack_88);
        paVar1 = &C->ptrlist_allocator;
        while (psVar13 != (symbol *)0x0) {
          pbVar14 = get_bound_block(C,ep,psVar13);
          pmVar15 = alloc_multijmp(C,pbVar14,1,0);
          ptrlist_add((ptr_list **)&(piVar8->field_6).field_0,pmVar15,paVar1);
          ptrlist_add((ptr_list **)&pbVar14->parents,ep->active,paVar1);
          ptrlist_add((ptr_list **)&pbVar10->children,pbVar14,paVar1);
          psVar13 = (symbol *)ptrlist_iter_next((ptr_list_iter *)auStack_88);
        }
        if (ep->active != (basic_block *)0x0) {
          ep->active = (basic_block *)0x0;
        }
        goto switchD_0012bde7_default;
      }
      psVar13 = (peVar11->field_5).field_4.symbol;
    }
    pbVar10 = get_bound_block(C,ep,psVar13);
    break;
  case STMT_ASM:
    piVar8 = alloc_instruction(C,0x3d,0);
    psVar5 = (stmt->field_2).field_4.stmts;
    if ((psVar5 == (statement_list *)0x0) || (*(char *)psVar5 != '\x02')) {
      dmrC_warning(C,stmt->pos,"expected string in inline asm");
    }
    else {
      (piVar8->field_6).field_1.bb_true = (basic_block *)&psVar5->list_[1]->pos;
      iVar16 = 0;
      pbVar10 = (basic_block *)dmrC_allocator_allocate(&C->L->asm_rules_allocator,0);
      (piVar8->field_6).field_1.bb_false = pbVar10;
      ptrlist_forward_iterator
                ((ptr_list_iter *)auStack_88,(ptr_list *)(stmt->field_2).field_3.if_false);
      peVar11 = (expression *)ptrlist_iter_next((ptr_list_iter *)auStack_88);
      local_48 = (basic_block *)0x0;
      local_50 = (expression *)0x0;
      while (peVar11 != (expression *)0x0) {
        if (iVar16 == 0) {
          iVar16 = 1;
          local_50 = peVar11;
        }
        else if (iVar16 == 2) {
          ppVar9 = linearize_expression(C,ep,peVar11);
          iVar16 = 0;
          pppVar12 = (pseudo_t *)dmrC_allocator_allocate(&C->L->asm_constraint_allocator,0);
          pppVar12[2] = (pseudo_t)local_50;
          pppVar12[1] = (pseudo_t)local_48;
          dmrC_use_pseudo(C,piVar8,ppVar9,pppVar12);
          ptrlist_add((ptr_list **)(piVar8->field_6).field_1.bb_false,pppVar12,&C->ptrlist_allocator
                     );
        }
        else {
          local_48 = (basic_block *)((long)&((peVar11->field_5).field_4.symbol_name)->next + 4);
          iVar16 = 2;
        }
        peVar11 = (expression *)ptrlist_iter_next((ptr_list_iter *)auStack_88);
      }
      add_one_insn(C,ep,piVar8);
      ptrlist_forward_iterator(&local_a8,(ptr_list *)(stmt->field_2).field_1.context);
      local_48 = (basic_block *)0x0;
      iVar16 = 0;
      local_50 = (expression *)0x0;
      while (peVar11 = (expression *)ptrlist_iter_next(&local_a8), peVar11 != (expression *)0x0) {
        if (iVar16 == 2) {
          ppVar9 = dmrC_alloc_pseudo(C,piVar8);
          auStack_88 = (undefined1  [8])0x0;
          symiter__.__head = (ptr_list *)0x0;
          symiter__.__list = (ptr_list *)0x0;
          symiter__.__nr = 0;
          symiter__._20_4_ = 0;
          iVar16 = linearize_address_gen(C,ep,peVar11,(access_data *)auStack_88);
          if (iVar16 != 0) {
            linearize_store_gen(C,ep,ppVar9,(access_data *)auStack_88);
            pppVar12 = (pseudo_t *)dmrC_allocator_allocate(&C->L->asm_constraint_allocator,0);
            pppVar12[2] = (pseudo_t)local_50;
            pppVar12[1] = (pseudo_t)local_48;
            dmrC_use_pseudo(C,piVar8,ppVar9,pppVar12);
            ptrlist_add((ptr_list **)&((piVar8->field_6).field_4.phi_users)->prev_,pppVar12,
                        &C->ptrlist_allocator);
          }
          iVar16 = 0;
        }
        else if (iVar16 == 0) {
          iVar16 = 1;
          local_50 = peVar11;
        }
        else {
          local_48 = (basic_block *)((long)&((peVar11->field_5).field_4.symbol_name)->next + 4);
          iVar16 = 2;
        }
      }
    }
    goto switchD_0012bde7_default;
  case STMT_CONTEXT:
    iVar16 = 0;
    piVar8 = alloc_instruction(C,0x3e,0);
    peVar11 = (stmt->field_2).field_1.expression;
    if (*(char *)peVar11 == '\x01') {
      iVar16 = (peVar11->field_5).field_2.wide;
    }
    (piVar8->field_6).field_10.increment = iVar16;
    (piVar8->field_6).field_1.bb_false = (basic_block *)(stmt->field_2).field_1.context;
    goto LAB_0012c1ce;
  case STMT_RANGE:
    piVar8 = alloc_instruction(C,0x3f,0);
    ppVar9 = linearize_expression(C,ep,(stmt->field_2).field_1.expression);
    dmrC_use_pseudo(C,piVar8,ppVar9,(pseudo_t *)&(piVar8->field_6).field_0);
    ppVar9 = linearize_expression(C,ep,(stmt->field_2).field_1.context);
    dmrC_use_pseudo(C,piVar8,ppVar9,&(piVar8->field_6).field_6.src2);
    ppVar9 = linearize_expression(C,ep,(stmt->field_2).field_11.range_high);
    dmrC_use_pseudo(C,piVar8,ppVar9,&(piVar8->field_6).field_6.src3);
LAB_0012c1ce:
    add_one_insn(C,ep,piVar8);
  default:
    goto switchD_0012bde7_default;
  }
  add_goto(C,ep,pbVar10);
  goto switchD_0012bde7_default;
switchD_0012bde7_caseD_9:
  psVar13 = (stmt->field_2).field_5.label_identifier;
  if ((psVar13->field_0x2 & 2) != 0) {
    add_label(C,ep,psVar13);
  }
  stmt = (stmt->field_2).field_3.if_true;
  goto LAB_0012bda3;
}

Assistant:

static pseudo_t linearize_statement(struct dmr_C *C, struct entrypoint *ep, struct statement *stmt)
{
	struct basic_block *bb;

	if (!stmt)
		return VOID_PSEUDO(C);

	bb = ep->active;
	if (bb && !bb->insns)
		bb->pos = stmt->pos;
	C->L->current_pos = stmt->pos;

	switch (stmt->type) {
	case STMT_NONE:
		break;

	case STMT_DECLARATION:
		return linearize_declaration(C, ep, stmt);

	case STMT_CONTEXT:
		return linearize_context(C, ep, stmt);

	case STMT_RANGE:
		return linearize_range(C, ep, stmt);

	case STMT_EXPRESSION:
		return linearize_expression(C, ep, stmt->expression);

	case STMT_ASM:
		return linearize_asm_statement(C, ep, stmt);

	case STMT_RETURN:
		return linearize_return(C, ep, stmt);

	case STMT_CASE: {
		add_label(C, ep, stmt->case_label);
		linearize_statement(C, ep, stmt->case_statement);
		break;
	}

	case STMT_LABEL: {
		struct symbol *label = stmt->label_identifier;

		if (label->used) {
			bb = add_label(C, ep, label);
		}
		return 	linearize_statement(C, ep, stmt->label_statement);
	}

	case STMT_GOTO: {
		struct symbol *sym;
		struct expression *expr;
		struct instruction *goto_ins;
		struct basic_block *active;
		pseudo_t pseudo;

		active = ep->active;
		if (!dmrC_bb_reachable(active))
			break;

		if (stmt->goto_label) {
			add_goto(C, ep, get_bound_block(C, ep, stmt->goto_label));
			break;
		}

		expr = stmt->goto_expression;
		if (!expr)
			break;

		/* This can happen as part of simplification */
		if (expr->type == EXPR_LABEL) {
			add_goto(C, ep, get_bound_block(C, ep, expr->label_symbol));
			break;
		}

		pseudo = linearize_expression(C, ep, expr);
		goto_ins = alloc_instruction(C, OP_COMPUTEDGOTO, 0);
		dmrC_use_pseudo(C, goto_ins, pseudo, &goto_ins->target);
		add_one_insn(C, ep, goto_ins);

		FOR_EACH_PTR(stmt->target_list, sym) {
			struct basic_block *bb_computed = get_bound_block(C, ep, sym);
			struct multijmp *jmp = alloc_multijmp(C, bb_computed, 1, 0);
			dmrC_add_multijmp(C, &goto_ins->multijmp_list, jmp);
			dmrC_add_bb(C, &bb_computed->parents, ep->active);
			dmrC_add_bb(C, &active->children, bb_computed);
		} END_FOR_EACH_PTR(sym);

		finish_block(ep);
		break;
	}

	case STMT_COMPOUND:
		if (stmt->inline_fn)
			return linearize_inlined_call(C, ep, stmt);
		return linearize_compound_statement(C, ep, stmt);

	/*
	 * This could take 'likely/unlikely' into account, and
	 * switch the arms around appropriately..
	 */
	case STMT_IF: {
		struct basic_block *bb_true, *bb_false, *endif;
 		struct expression *cond = stmt->if_conditional;

		bb_true = alloc_basic_block(C, ep, stmt->pos);
		bb_false = endif = alloc_basic_block(C, ep, stmt->pos);

 		linearize_cond_branch(C, ep, cond, bb_true, bb_false);

		set_activeblock(C, ep, bb_true);
 		linearize_statement(C, ep, stmt->if_true);
 
 		if (stmt->if_false) {
			endif = alloc_basic_block(C, ep, stmt->pos);
			add_goto(C, ep, endif);
			set_activeblock(C, ep, bb_false);
 			linearize_statement(C, ep, stmt->if_false);
		}
		set_activeblock(C, ep, endif);
		break;
	}

	case STMT_SWITCH:
		return linearize_switch(C, ep, stmt);

	case STMT_ITERATOR:
		return linearize_iterator(C, ep, stmt);

	default:
		break;
	}
	return VOID_PSEUDO(C);
}